

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  vfloat<4> vVar2;
  size_t sVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  bool bVar23;
  byte bVar24;
  int iVar25;
  AABBNodeMB4D *node1;
  long lVar26;
  long lVar27;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar28;
  byte bVar29;
  size_t sVar30;
  uint uVar31;
  byte bVar32;
  undefined4 uVar33;
  NodeRef root;
  long lVar34;
  NodeRef *pNVar35;
  byte bVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar61;
  float fVar62;
  vint4 ai_2;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar63;
  vint4 ai;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai_1;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  vint4 ai_3;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  vint4 bi;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  vint4 bi_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  vint4 bi_3;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  vint4 bi_2;
  undefined1 auVar80 [16];
  uint uVar81;
  uint uVar82;
  uint uVar83;
  uint uVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar96 [64];
  uint local_1a08;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined1 local_1988 [16];
  BVH *local_1970;
  Intersectors *local_1968;
  ulong local_1960;
  long local_1958;
  long local_1950;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1948;
  undefined1 local_1938 [16];
  undefined1 local_1928 [16];
  undefined1 local_1918 [16];
  undefined1 local_1908 [8];
  float fStack_1900;
  float fStack_18fc;
  undefined1 local_18f8 [8];
  float fStack_18f0;
  float fStack_18ec;
  undefined1 local_18e8 [8];
  float fStack_18e0;
  float fStack_18dc;
  TravRayK<4,_false> tray;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1798;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined1 local_1758 [8];
  float fStack_1750;
  float fStack_174c;
  undefined1 local_1748 [8];
  float fStack_1740;
  float fStack_173c;
  undefined1 local_1738 [16];
  uint local_1728;
  uint uStack_1724;
  uint uStack_1720;
  uint uStack_171c;
  uint uStack_1718;
  uint uStack_1714;
  uint uStack_1710;
  uint uStack_170c;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  local_1970 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1970->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar41 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar56 = ZEXT816(0) << 0x40;
    uVar7 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar56,5);
    uVar37 = vpcmpeqd_avx512vl(auVar41,(undefined1  [16])valid_i->field_0);
    uVar37 = ((byte)uVar7 & 0xf) & uVar37;
    bVar36 = (byte)uVar37;
    if (bVar36 != 0) {
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar44._8_4_ = 0x7fffffff;
      auVar44._0_8_ = 0x7fffffff7fffffff;
      auVar44._12_4_ = 0x7fffffff;
      auVar41 = vandps_avx(auVar44,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar39._8_4_ = 0x219392ef;
      auVar39._0_8_ = 0x219392ef219392ef;
      auVar39._12_4_ = 0x219392ef;
      uVar38 = vcmpps_avx512vl(auVar41,auVar39,1);
      bVar23 = (bool)((byte)uVar38 & 1);
      auVar40._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._0_4_;
      bVar23 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._4_4_;
      bVar23 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._8_4_;
      bVar23 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._12_4_;
      auVar41 = vandps_avx(auVar44,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      uVar38 = vcmpps_avx512vl(auVar41,auVar39,1);
      bVar23 = (bool)((byte)uVar38 & 1);
      auVar42._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._16_4_;
      bVar23 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._20_4_;
      bVar23 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._24_4_;
      bVar23 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar42._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._28_4_;
      auVar41 = vandps_avx(auVar44,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      uVar38 = vcmpps_avx512vl(auVar41,auVar39,1);
      bVar23 = (bool)((byte)uVar38 & 1);
      auVar48._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._32_4_;
      bVar23 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar48._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._36_4_;
      bVar23 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar48._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._40_4_;
      bVar23 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar48._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._44_4_;
      auVar43._8_4_ = 0x3f800000;
      auVar43._0_8_ = 0x3f8000003f800000;
      auVar43._12_4_ = 0x3f800000;
      auVar39 = vrcp14ps_avx512vl(auVar40);
      auVar41 = vfnmadd213ps_fma(auVar40,auVar39,auVar43);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar41,auVar39,auVar39)
      ;
      auVar40 = vrcp14ps_avx512vl(auVar42);
      auVar41 = vfnmadd213ps_fma(auVar42,auVar40,auVar43);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar41,auVar40,auVar40)
      ;
      auVar40 = vrcp14ps_avx512vl(auVar48);
      auVar41 = vfnmadd213ps_fma(auVar48,auVar40,auVar43);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar41,auVar40,auVar40)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      uVar38 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar56,1);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar38 & 1) * auVar41._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar41._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar41._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar41._12_4_;
      uVar38 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar56,5);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar23 = (bool)((byte)uVar38 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar23 * auVar41._0_4_ | (uint)!bVar23 * 0x30;
      bVar23 = (bool)((byte)(uVar38 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar23 * auVar41._4_4_ | (uint)!bVar23 * 0x30;
      bVar23 = (bool)((byte)(uVar38 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar23 * auVar41._8_4_ | (uint)!bVar23 * 0x30;
      bVar23 = (bool)((byte)(uVar38 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar23 * auVar41._12_4_ | (uint)!bVar23 * 0x30;
      uVar38 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar56,5);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar23 = (bool)((byte)uVar38 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar23 * auVar41._0_4_ | (uint)!bVar23 * 0x50;
      bVar23 = (bool)((byte)(uVar38 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar23 * auVar41._4_4_ | (uint)!bVar23 * 0x50;
      bVar23 = (bool)((byte)(uVar38 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar23 * auVar41._8_4_ | (uint)!bVar23 * 0x50;
      bVar23 = (bool)((byte)(uVar38 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar23 * auVar41._12_4_ | (uint)!bVar23 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar94 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar41 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar56);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar36 & 1) * auVar41._0_4_ |
           (uint)!(bool)(bVar36 & 1) * stack_near[0].field_0._0_4_;
      bVar23 = (bool)((byte)(uVar37 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar23 * auVar41._4_4_ | (uint)!bVar23 * stack_near[0].field_0._4_4_;
      bVar23 = (bool)((byte)(uVar37 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar23 * auVar41._8_4_ | (uint)!bVar23 * stack_near[0].field_0._8_4_;
      bVar23 = SUB81(uVar37 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar23 * auVar41._12_4_ | (uint)!bVar23 * stack_near[0].field_0._12_4_;
      auVar41 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar56);
      tray.tfar.field_0.i[0] =
           (uint)(bVar36 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar36 & 1) * -0x800000;
      bVar23 = (bool)((byte)(uVar37 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar23 * auVar41._4_4_ | (uint)!bVar23 * -0x800000;
      bVar23 = (bool)((byte)(uVar37 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar23 * auVar41._8_4_ | (uint)!bVar23 * -0x800000;
      bVar23 = SUB81(uVar37 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar23 * auVar41._12_4_ | (uint)!bVar23 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 3;
      }
      else {
        uVar31 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      uVar37 = uVar37 ^ 0xf;
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar28 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar95 = ZEXT1664(auVar41);
      auVar41 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
      auVar96 = ZEXT1664(auVar41);
      local_1968 = This;
LAB_01c8d201:
      local_1a08 = (uint)uVar37;
LAB_01c8d206:
      do {
        do {
          root.ptr = pNVar35[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01c8dc5f;
          pNVar35 = pNVar35 + -1;
          paVar28 = paVar28 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar28->v;
          auVar91 = ZEXT1664((undefined1  [16])vVar2.field_0);
          uVar37 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar37 == '\0');
        uVar33 = (undefined4)uVar37;
        if (uVar31 < (uint)POPCOUNT(uVar33)) {
LAB_01c8d246:
          do {
            lVar26 = -0x10;
            uVar81 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01c8dc5f;
              uVar7 = vcmpps_avx512vl(auVar91._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar7 == '\0') goto LAB_01c8d206;
              local_1958 = (ulong)(uVar81 & 0xf) - 8;
              bVar29 = ~(byte)local_1a08 & 0xf;
              lVar34 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              lVar26 = 0;
              goto LAB_01c8d576;
            }
            uVar7 = vcmpps_avx512vl(auVar91._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar37 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            auVar41 = auVar94._0_16_;
            for (; (auVar91 = ZEXT1664(auVar41), lVar26 != 0 &&
                   (sVar3 = *(size_t *)(uVar37 + 0x20 + lVar26 * 2), sVar3 != 8));
                lVar26 = lVar26 + 4) {
              uVar33 = *(undefined4 *)(uVar37 + 0x90 + lVar26);
              auVar64._4_4_ = uVar33;
              auVar64._0_4_ = uVar33;
              auVar64._8_4_ = uVar33;
              auVar64._12_4_ = uVar33;
              auVar56 = *(undefined1 (*) [16])(ray + 0x70);
              uVar33 = *(undefined4 *)(uVar37 + 0x30 + lVar26);
              auVar11._4_4_ = uVar33;
              auVar11._0_4_ = uVar33;
              auVar11._8_4_ = uVar33;
              auVar11._12_4_ = uVar33;
              auVar40 = vfmadd213ps_avx512vl(auVar64,auVar56,auVar11);
              uVar33 = *(undefined4 *)(uVar37 + 0xb0 + lVar26);
              auVar66._4_4_ = uVar33;
              auVar66._0_4_ = uVar33;
              auVar66._8_4_ = uVar33;
              auVar66._12_4_ = uVar33;
              uVar33 = *(undefined4 *)(uVar37 + 0x50 + lVar26);
              auVar12._4_4_ = uVar33;
              auVar12._0_4_ = uVar33;
              auVar12._8_4_ = uVar33;
              auVar12._12_4_ = uVar33;
              auVar42 = vfmadd213ps_avx512vl(auVar66,auVar56,auVar12);
              uVar33 = *(undefined4 *)(uVar37 + 0xd0 + lVar26);
              auVar69._4_4_ = uVar33;
              auVar69._0_4_ = uVar33;
              auVar69._8_4_ = uVar33;
              auVar69._12_4_ = uVar33;
              uVar33 = *(undefined4 *)(uVar37 + 0x70 + lVar26);
              auVar13._4_4_ = uVar33;
              auVar13._0_4_ = uVar33;
              auVar13._8_4_ = uVar33;
              auVar13._12_4_ = uVar33;
              auVar43 = vfmadd213ps_avx512vl(auVar69,auVar56,auVar13);
              uVar33 = *(undefined4 *)(uVar37 + 0xa0 + lVar26);
              auVar71._4_4_ = uVar33;
              auVar71._0_4_ = uVar33;
              auVar71._8_4_ = uVar33;
              auVar71._12_4_ = uVar33;
              uVar33 = *(undefined4 *)(uVar37 + 0x40 + lVar26);
              auVar14._4_4_ = uVar33;
              auVar14._0_4_ = uVar33;
              auVar14._8_4_ = uVar33;
              auVar14._12_4_ = uVar33;
              auVar44 = vfmadd213ps_avx512vl(auVar71,auVar56,auVar14);
              uVar33 = *(undefined4 *)(uVar37 + 0xc0 + lVar26);
              auVar73._4_4_ = uVar33;
              auVar73._0_4_ = uVar33;
              auVar73._8_4_ = uVar33;
              auVar73._12_4_ = uVar33;
              uVar33 = *(undefined4 *)(uVar37 + 0x60 + lVar26);
              auVar15._4_4_ = uVar33;
              auVar15._0_4_ = uVar33;
              auVar15._8_4_ = uVar33;
              auVar15._12_4_ = uVar33;
              auVar45 = vfmadd213ps_avx512vl(auVar73,auVar56,auVar15);
              uVar33 = *(undefined4 *)(uVar37 + 0xe0 + lVar26);
              auVar76._4_4_ = uVar33;
              auVar76._0_4_ = uVar33;
              auVar76._8_4_ = uVar33;
              auVar76._12_4_ = uVar33;
              uVar33 = *(undefined4 *)(uVar37 + 0x80 + lVar26);
              auVar16._4_4_ = uVar33;
              auVar16._0_4_ = uVar33;
              auVar16._8_4_ = uVar33;
              auVar16._12_4_ = uVar33;
              auVar46 = vfmadd213ps_avx512vl(auVar76,auVar56,auVar16);
              auVar21._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar21._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar21._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar21._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar22._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar22._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar22._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar22._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar48 = vfmsub213ps_fma(auVar40,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar21);
              auVar39 = vfmsub213ps_fma(auVar42,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar22);
              auVar43 = vfmsub213ps_fma(auVar43,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,
                                        (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0);
              auVar44 = vfmsub213ps_fma(auVar44,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar21);
              auVar45 = vfmsub213ps_fma(auVar45,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar22);
              auVar46 = vfmsub213ps_fma(auVar46,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,
                                        (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0);
              auVar40 = vpminsd_avx(auVar48,auVar44);
              auVar42 = vpminsd_avx(auVar39,auVar45);
              auVar40 = vpmaxsd_avx(auVar40,auVar42);
              auVar42 = vpminsd_avx(auVar43,auVar46);
              auVar40 = vpmaxsd_avx(auVar40,auVar42);
              auVar42 = vpmaxsd_avx(auVar48,auVar44);
              auVar48 = vpmaxsd_avx(auVar39,auVar45);
              auVar48 = vpminsd_avx(auVar42,auVar48);
              auVar42 = vpmaxsd_avx(auVar43,auVar46);
              auVar48 = vpminsd_avx(auVar48,auVar42);
              auVar42 = vpmaxsd_avx(auVar40,(undefined1  [16])tray.tnear.field_0);
              auVar48 = vpminsd_avx(auVar48,(undefined1  [16])tray.tfar.field_0);
              uVar8 = vcmpps_avx512vl(auVar42,auVar48,2);
              bVar29 = (byte)uVar8;
              if ((uVar81 & 7) == 6) {
                uVar33 = *(undefined4 *)(uVar37 + 0x100 + lVar26);
                auVar17._4_4_ = uVar33;
                auVar17._0_4_ = uVar33;
                auVar17._8_4_ = uVar33;
                auVar17._12_4_ = uVar33;
                uVar8 = vcmpps_avx512vl(auVar56,auVar17,1);
                uVar33 = *(undefined4 *)(uVar37 + 0xf0 + lVar26);
                auVar18._4_4_ = uVar33;
                auVar18._0_4_ = uVar33;
                auVar18._8_4_ = uVar33;
                auVar18._12_4_ = uVar33;
                uVar9 = vcmpps_avx512vl(auVar56,auVar18,0xd);
                bVar29 = (byte)uVar8 & (byte)uVar9 & bVar29;
              }
              bVar29 = bVar29 & (byte)uVar7;
              sVar30 = root.ptr;
              auVar47 = auVar41;
              if (bVar29 != 0) {
                auVar40 = vblendmps_avx512vl(auVar94._0_16_,auVar40);
                auVar47._0_4_ =
                     (uint)(bVar29 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar56._0_4_;
                bVar23 = (bool)(bVar29 >> 1 & 1);
                auVar47._4_4_ = (uint)bVar23 * auVar40._4_4_ | (uint)!bVar23 * auVar56._4_4_;
                bVar23 = (bool)(bVar29 >> 2 & 1);
                auVar47._8_4_ = (uint)bVar23 * auVar40._8_4_ | (uint)!bVar23 * auVar56._8_4_;
                bVar23 = (bool)(bVar29 >> 3 & 1);
                auVar47._12_4_ = (uint)bVar23 * auVar40._12_4_ | (uint)!bVar23 * auVar56._12_4_;
                sVar30 = sVar3;
                if (root.ptr != 8) {
                  pNVar35->ptr = root.ptr;
                  pNVar35 = pNVar35 + 1;
                  *(undefined1 (*) [16])paVar28->v = auVar41;
                  paVar28 = paVar28 + 1;
                }
              }
              auVar41 = auVar47;
              root.ptr = sVar30;
            }
            if (root.ptr == 8) goto LAB_01c8d42a;
            uVar7 = vcmpps_avx512vl(auVar41,(undefined1  [16])tray.tfar.field_0,9);
          } while ((byte)uVar31 < (byte)POPCOUNT((int)uVar7));
          pNVar35->ptr = root.ptr;
          pNVar35 = pNVar35 + 1;
          *(undefined1 (*) [16])paVar28->v = auVar41;
          paVar28 = paVar28 + 1;
LAB_01c8d42a:
          iVar25 = 4;
        }
        else {
          while( true ) {
            auVar41 = auVar96._0_16_;
            if (uVar37 == 0) break;
            sVar3 = 0;
            for (uVar38 = uVar37; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
              sVar3 = sVar3 + 1;
            }
            uVar37 = uVar37 - 1 & uVar37;
            bVar23 = occluded1(local_1968,local_1970,root,sVar3,&pre,ray,&tray,context);
            auVar41 = vxorps_avx512vl(auVar41,auVar41);
            auVar96 = ZEXT1664(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar95 = ZEXT1664(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar94 = ZEXT1664(auVar41);
            bVar29 = (byte)(1 << ((uint)sVar3 & 0x1f));
            if (!bVar23) {
              bVar29 = 0;
            }
            local_1a08 = (uint)((byte)local_1a08 | bVar29);
          }
          iVar25 = 3;
          auVar91 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if ((byte)local_1a08 != 0xf) {
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_1a08 & 1) * auVar41._0_4_ |
                 (uint)!(bool)((byte)local_1a08 & 1) * tray.tfar.field_0.i[0];
            bVar23 = (bool)((byte)(local_1a08 >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar23 * auVar41._4_4_ | (uint)!bVar23 * tray.tfar.field_0.i[1];
            bVar23 = (bool)((byte)(local_1a08 >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar23 * auVar41._8_4_ | (uint)!bVar23 * tray.tfar.field_0.i[2];
            bVar23 = (bool)((byte)(local_1a08 >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar23 * auVar41._12_4_ | (uint)!bVar23 * tray.tfar.field_0.i[3];
            iVar25 = 2;
          }
          if (uVar31 < (uint)POPCOUNT(uVar33)) goto LAB_01c8d246;
        }
      } while ((iVar25 == 4) || (iVar25 == 2));
      goto LAB_01c8dc5f;
    }
  }
  return;
LAB_01c8d576:
  do {
    lVar27 = -0x10;
    bVar32 = bVar29;
    if (lVar26 == local_1958) goto LAB_01c8dc24;
    do {
      local_1950 = lVar26;
      if ((lVar27 == 0) || (uVar37 = (ulong)*(uint *)(lVar34 + lVar27), uVar37 == 0xffffffff))
      goto LAB_01c8dc07;
      auVar41 = *(undefined1 (*) [16])(ray + 0x40);
      auVar56 = *(undefined1 (*) [16])(ray + 0x50);
      auVar40 = *(undefined1 (*) [16])(ray + 0x60);
      auVar42 = *(undefined1 (*) [16])(ray + 0x70);
      uVar33 = *(undefined4 *)(lVar34 + -0x90 + lVar27);
      auVar67._4_4_ = uVar33;
      auVar67._0_4_ = uVar33;
      auVar67._8_4_ = uVar33;
      auVar67._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x80 + lVar27);
      auVar74._4_4_ = uVar33;
      auVar74._0_4_ = uVar33;
      auVar74._8_4_ = uVar33;
      auVar74._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x70 + lVar27);
      auVar77._4_4_ = uVar33;
      auVar77._0_4_ = uVar33;
      auVar77._8_4_ = uVar33;
      auVar77._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x120 + lVar27);
      auVar45._4_4_ = uVar33;
      auVar45._0_4_ = uVar33;
      auVar45._8_4_ = uVar33;
      auVar45._12_4_ = uVar33;
      auVar44 = vfmadd213ps_avx512vl(auVar67,auVar42,auVar45);
      uVar33 = *(undefined4 *)(lVar34 + -0x110 + lVar27);
      auVar46._4_4_ = uVar33;
      auVar46._0_4_ = uVar33;
      auVar46._8_4_ = uVar33;
      auVar46._12_4_ = uVar33;
      auVar45 = vfmadd213ps_avx512vl(auVar74,auVar42,auVar46);
      uVar33 = *(undefined4 *)(lVar34 + -0x100 + lVar27);
      auVar49._4_4_ = uVar33;
      auVar49._0_4_ = uVar33;
      auVar49._8_4_ = uVar33;
      auVar49._12_4_ = uVar33;
      auVar46 = vfmadd213ps_avx512vl(auVar77,auVar42,auVar49);
      uVar33 = *(undefined4 *)(lVar34 + -0x60 + lVar27);
      auVar59._4_4_ = uVar33;
      auVar59._0_4_ = uVar33;
      auVar59._8_4_ = uVar33;
      auVar59._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x50 + lVar27);
      auVar65._4_4_ = uVar33;
      auVar65._0_4_ = uVar33;
      auVar65._8_4_ = uVar33;
      auVar65._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x40 + lVar27);
      auVar85._4_4_ = uVar33;
      auVar85._0_4_ = uVar33;
      auVar85._8_4_ = uVar33;
      auVar85._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0xf0 + lVar27);
      auVar50._4_4_ = uVar33;
      auVar50._0_4_ = uVar33;
      auVar50._8_4_ = uVar33;
      auVar50._12_4_ = uVar33;
      auVar48 = vfmadd213ps_avx512vl(auVar59,auVar42,auVar50);
      uVar33 = *(undefined4 *)(lVar34 + -0xe0 + lVar27);
      auVar51._4_4_ = uVar33;
      auVar51._0_4_ = uVar33;
      auVar51._8_4_ = uVar33;
      auVar51._12_4_ = uVar33;
      auVar39 = vfmadd213ps_avx512vl(auVar65,auVar42,auVar51);
      uVar33 = *(undefined4 *)(lVar34 + -0xd0 + lVar27);
      auVar55._4_4_ = uVar33;
      auVar55._0_4_ = uVar33;
      auVar55._8_4_ = uVar33;
      auVar55._12_4_ = uVar33;
      auVar43 = vfmadd213ps_avx512vl(auVar85,auVar42,auVar55);
      uVar33 = *(undefined4 *)(lVar34 + -0x30 + lVar27);
      auVar87._4_4_ = uVar33;
      auVar87._0_4_ = uVar33;
      auVar87._8_4_ = uVar33;
      auVar87._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x20 + lVar27);
      auVar89._4_4_ = uVar33;
      auVar89._0_4_ = uVar33;
      auVar89._8_4_ = uVar33;
      auVar89._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x10 + lVar27);
      auVar92._4_4_ = uVar33;
      auVar92._0_4_ = uVar33;
      auVar92._8_4_ = uVar33;
      auVar92._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0xc0 + lVar27);
      auVar54._4_4_ = uVar33;
      auVar54._0_4_ = uVar33;
      auVar54._8_4_ = uVar33;
      auVar54._12_4_ = uVar33;
      auVar49 = vfmadd213ps_avx512vl(auVar87,auVar42,auVar54);
      uVar33 = *(undefined4 *)(lVar34 + -0xb0 + lVar27);
      auVar52._4_4_ = uVar33;
      auVar52._0_4_ = uVar33;
      auVar52._8_4_ = uVar33;
      auVar52._12_4_ = uVar33;
      auVar50 = vfmadd213ps_avx512vl(auVar89,auVar42,auVar52);
      uVar33 = *(undefined4 *)(lVar34 + -0xa0 + lVar27);
      auVar53._4_4_ = uVar33;
      auVar53._0_4_ = uVar33;
      auVar53._8_4_ = uVar33;
      auVar53._12_4_ = uVar33;
      auVar51 = vfmadd213ps_avx512vl(auVar92,auVar42,auVar53);
      auVar42 = vsubps_avx(auVar44,auVar48);
      auVar48 = vsubps_avx(auVar45,auVar39);
      auVar39 = vsubps_avx(auVar46,auVar43);
      auVar43 = vsubps_avx(auVar49,auVar44);
      auVar52 = vsubps_avx512vl(auVar50,auVar45);
      auVar53 = vsubps_avx512vl(auVar51,auVar46);
      auVar49 = vmulps_avx512vl(auVar48,auVar53);
      auVar54 = vfmsub231ps_avx512vl(auVar49,auVar52,auVar39);
      auVar60._0_4_ = auVar39._0_4_ * auVar43._0_4_;
      auVar60._4_4_ = auVar39._4_4_ * auVar43._4_4_;
      auVar60._8_4_ = auVar39._8_4_ * auVar43._8_4_;
      auVar60._12_4_ = auVar39._12_4_ * auVar43._12_4_;
      auVar55 = vfmsub231ps_avx512vl(auVar60,auVar53,auVar42);
      auVar49 = vmulps_avx512vl(auVar42,auVar52);
      aVar10 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
               vfmsub231ps_fma(auVar49,auVar43,auVar48);
      auVar44 = vsubps_avx(auVar44,*(undefined1 (*) [16])ray);
      auVar45 = vsubps_avx(auVar45,*(undefined1 (*) [16])(ray + 0x10));
      auVar46 = vsubps_avx(auVar46,*(undefined1 (*) [16])(ray + 0x20));
      auVar88._0_4_ = auVar56._0_4_ * auVar46._0_4_;
      auVar88._4_4_ = auVar56._4_4_ * auVar46._4_4_;
      auVar88._8_4_ = auVar56._8_4_ * auVar46._8_4_;
      auVar88._12_4_ = auVar56._12_4_ * auVar46._12_4_;
      auVar49 = vfmsub231ps_fma(auVar88,auVar45,auVar40);
      auVar90._0_4_ = auVar40._0_4_ * auVar44._0_4_;
      auVar90._4_4_ = auVar40._4_4_ * auVar44._4_4_;
      auVar90._8_4_ = auVar40._8_4_ * auVar44._8_4_;
      auVar90._12_4_ = auVar40._12_4_ * auVar44._12_4_;
      auVar50 = vfmsub231ps_fma(auVar90,auVar46,auVar41);
      auVar93._0_4_ = auVar41._0_4_ * auVar45._0_4_;
      auVar93._4_4_ = auVar41._4_4_ * auVar45._4_4_;
      auVar93._8_4_ = auVar41._8_4_ * auVar45._8_4_;
      auVar93._12_4_ = auVar41._12_4_ * auVar45._12_4_;
      auVar51 = vfmsub231ps_fma(auVar93,auVar44,auVar56);
      auVar70._0_4_ = aVar10.v[0] * auVar40._0_4_;
      auVar70._4_4_ = aVar10.v[1] * auVar40._4_4_;
      auVar70._8_4_ = aVar10.v[2] * auVar40._8_4_;
      auVar70._12_4_ = aVar10.v[3] * auVar40._12_4_;
      auVar56 = vfmadd231ps_fma(auVar70,auVar55,auVar56);
      auVar41 = vfmadd231ps_fma(auVar56,auVar54,auVar41);
      auVar40 = vandps_avx512vl(auVar41,auVar95._0_16_);
      auVar56 = vmulps_avx512vl(auVar53,auVar51);
      auVar56 = vfmadd231ps_avx512vl(auVar56,auVar50,auVar52);
      auVar56 = vfmadd231ps_fma(auVar56,auVar49,auVar43);
      uVar81 = auVar40._0_4_;
      auVar72._0_4_ = uVar81 ^ auVar56._0_4_;
      uVar82 = auVar40._4_4_;
      auVar72._4_4_ = uVar82 ^ auVar56._4_4_;
      uVar83 = auVar40._8_4_;
      auVar72._8_4_ = uVar83 ^ auVar56._8_4_;
      uVar84 = auVar40._12_4_;
      auVar72._12_4_ = uVar84 ^ auVar56._12_4_;
      auVar56 = auVar96._0_16_;
      uVar7 = vcmpps_avx512vl(auVar72,auVar56,5);
      bVar24 = (byte)uVar7 & bVar32;
      if (bVar24 == 0) {
LAB_01c8d6f8:
        bVar24 = 0;
      }
      else {
        auVar86._0_4_ = auVar39._0_4_ * auVar51._0_4_;
        auVar86._4_4_ = auVar39._4_4_ * auVar51._4_4_;
        auVar86._8_4_ = auVar39._8_4_ * auVar51._8_4_;
        auVar86._12_4_ = auVar39._12_4_ * auVar51._12_4_;
        auVar40 = vfmadd213ps_fma(auVar50,auVar48,auVar86);
        auVar40 = vfmadd213ps_fma(auVar49,auVar42,auVar40);
        auVar80._0_4_ = uVar81 ^ auVar40._0_4_;
        auVar80._4_4_ = uVar82 ^ auVar40._4_4_;
        auVar80._8_4_ = uVar83 ^ auVar40._8_4_;
        auVar80._12_4_ = uVar84 ^ auVar40._12_4_;
        uVar7 = vcmpps_avx512vl(auVar80,auVar56,5);
        bVar24 = bVar24 & (byte)uVar7;
        if (bVar24 == 0) goto LAB_01c8d6f8;
        auVar20._8_4_ = 0x7fffffff;
        auVar20._0_8_ = 0x7fffffff7fffffff;
        auVar20._12_4_ = 0x7fffffff;
        auVar42 = vandps_avx512vl(auVar41,auVar20);
        auVar40 = vsubps_avx(auVar42,auVar72);
        uVar7 = vcmpps_avx512vl(auVar40,auVar80,5);
        bVar24 = bVar24 & (byte)uVar7;
        if (bVar24 == 0) goto LAB_01c8d6f8;
        auVar78._0_4_ = auVar46._0_4_ * aVar10.v[0];
        auVar78._4_4_ = auVar46._4_4_ * aVar10.v[1];
        auVar78._8_4_ = auVar46._8_4_ * aVar10.v[2];
        auVar78._12_4_ = auVar46._12_4_ * aVar10.v[3];
        auVar40 = vfmadd213ps_fma(auVar45,auVar55,auVar78);
        auVar40 = vfmadd213ps_fma(auVar44,auVar54,auVar40);
        auVar75._0_4_ = auVar42._0_4_ * *(float *)(ray + 0x30);
        auVar75._4_4_ = auVar42._4_4_ * *(float *)(ray + 0x34);
        auVar75._8_4_ = auVar42._8_4_ * *(float *)(ray + 0x38);
        auVar75._12_4_ = auVar42._12_4_ * *(float *)(ray + 0x3c);
        auVar68._0_4_ = uVar81 ^ auVar40._0_4_;
        auVar68._4_4_ = uVar82 ^ auVar40._4_4_;
        auVar68._8_4_ = uVar83 ^ auVar40._8_4_;
        auVar68._12_4_ = uVar84 ^ auVar40._12_4_;
        auVar79._0_4_ = auVar42._0_4_ * *(float *)(ray + 0x80);
        auVar79._4_4_ = auVar42._4_4_ * *(float *)(ray + 0x84);
        auVar79._8_4_ = auVar42._8_4_ * *(float *)(ray + 0x88);
        auVar79._12_4_ = auVar42._12_4_ * *(float *)(ray + 0x8c);
        uVar7 = vcmpps_avx512vl(auVar68,auVar79,2);
        uVar8 = vcmpps_avx512vl(auVar75,auVar68,1);
        bVar24 = bVar24 & (byte)uVar7 & (byte)uVar8;
        if (bVar24 == 0) {
LAB_01c8dbfd:
          bVar24 = 0;
          aVar10 = local_1948;
          auVar55 = local_1938;
          auVar54 = local_1928;
          auVar42 = local_1918;
          auVar68 = _local_1908;
          auVar80 = _local_18f8;
          auVar72 = _local_18e8;
        }
        else {
          uVar7 = vcmpps_avx512vl(auVar41,ZEXT816(0) << 0x20,4);
          bVar24 = bVar24 & (byte)uVar7;
          if (bVar24 == 0) goto LAB_01c8dbfd;
        }
        _local_18e8 = auVar72;
        _local_18f8 = auVar80;
        _local_1908 = auVar68;
        local_1918 = auVar42;
        local_1928 = auVar54;
        local_1938 = auVar55;
        local_1948 = aVar10;
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar94 = ZEXT1664(auVar41);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar95 = ZEXT1664(auVar41);
        auVar41 = vxorps_avx512vl(auVar56,auVar56);
        auVar96 = ZEXT1664(auVar41);
      }
      auVar56 = auVar96._0_16_;
      pGVar4 = (context->scene->geometries).items[uVar37].ptr;
      uVar81 = pGVar4->mask;
      auVar41._4_4_ = uVar81;
      auVar41._0_4_ = uVar81;
      auVar41._8_4_ = uVar81;
      auVar41._12_4_ = uVar81;
      uVar7 = vptestmd_avx512vl(auVar41,*(undefined1 (*) [16])(ray + 0x90));
      bVar24 = (byte)uVar7 & 0xf & bVar24;
      uVar38 = (ulong)bVar24;
      if (bVar24 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar41 = vrcp14ps_avx512vl(local_1918);
          auVar19._8_4_ = 0x3f800000;
          auVar19._0_8_ = 0x3f8000003f800000;
          auVar19._12_4_ = 0x3f800000;
          auVar40 = vfnmadd213ps_avx512vl(auVar41,local_1918,auVar19);
          auVar41 = vfmadd132ps_fma(auVar40,auVar41,auVar41);
          fVar58 = auVar41._0_4_;
          fVar61 = auVar41._4_4_;
          fVar62 = auVar41._8_4_;
          fVar63 = auVar41._12_4_;
          local_1798._0_8_ = local_1928._0_8_;
          local_1798._8_8_ = local_1928._8_8_;
          local_1798._16_8_ = local_1938._0_8_;
          local_1798._24_8_ = local_1938._8_8_;
          local_1798.field_0.z.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)local_1948;
          local_1768 = CONCAT44(fVar61 * (float)local_1908._4_4_,fVar58 * (float)local_1908._0_4_);
          uStack_1760 = CONCAT44(fVar63 * fStack_18fc,fVar62 * fStack_1900);
          local_1758._4_4_ = fVar61 * (float)local_18f8._4_4_;
          local_1758._0_4_ = fVar58 * (float)local_18f8._0_4_;
          fStack_1750 = fVar62 * fStack_18f0;
          fStack_174c = fVar63 * fStack_18ec;
          local_1748._4_4_ = fVar61 * (float)local_18e8._4_4_;
          local_1748._0_4_ = fVar58 * (float)local_18e8._0_4_;
          fStack_1740 = fVar62 * fStack_18e0;
          fStack_173c = fVar63 * fStack_18dc;
          args.valid = (int *)&Ng;
          args.geometryUserPtr = &t;
          args.context = (RTCRayQueryContext *)&v;
          args.ray = (RTCRayN *)&u;
          local_1960 = uVar37;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                               *)&local_1798.field_0);
          local_1738 = vpbroadcastd_avx512vl();
          _local_1748 = vpbroadcastd_avx512vl();
          local_1798._0_8_ = Ng.field_0._0_8_;
          local_1798._8_8_ = Ng.field_0._8_8_;
          local_1798._16_8_ = Ng.field_0._16_8_;
          local_1798._24_8_ = Ng.field_0._24_8_;
          local_1768 = u.field_0._0_8_;
          uStack_1760 = u.field_0._8_8_;
          _local_1758 = v.field_0;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_1724 = context->user->instID[0];
          local_1728 = uStack_1724;
          uStack_1720 = uStack_1724;
          uStack_171c = uStack_1724;
          uStack_1718 = context->user->instPrimID[0];
          uStack_1714 = uStack_1718;
          uStack_1710 = uStack_1718;
          uStack_170c = uStack_1718;
          auVar41 = *(undefined1 (*) [16])(ray + 0x80);
          auVar40 = vblendmps_avx512vl(auVar41,(undefined1  [16])t.field_0);
          bVar23 = (bool)(bVar24 >> 1 & 1);
          bVar6 = (bool)(bVar24 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)(bVar24 & 1) * auVar40._0_4_ | !(bool)(bVar24 & 1) * uStack_1718;
          *(uint *)(ray + 0x84) = (uint)bVar23 * auVar40._4_4_ | !bVar23 * uStack_1718;
          *(uint *)(ray + 0x88) = (uint)bVar6 * auVar40._8_4_ | !bVar6 * uStack_1718;
          *(uint *)(ray + 0x8c) =
               (uint)(bVar24 >> 3) * auVar40._12_4_ | !(bool)(bVar24 >> 3) * uStack_1718;
          local_1988 = vpmovm2d_avx512vl(uVar38);
          args.valid = (int *)local_1988;
          args.geometryUserPtr = pGVar4->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1798;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar4->occlusionFilterN)(&args);
          }
          uVar37 = vptestmd_avx512vl(local_1988,local_1988);
          if ((uVar37 & 0xf) == 0) {
            uVar38 = 0;
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar94 = ZEXT1664(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar95 = ZEXT1664(auVar40);
            auVar56 = vxorps_avx512vl(auVar56,auVar56);
            auVar96 = ZEXT1664(auVar56);
          }
          else {
            p_Var5 = context->args->filter;
            if (p_Var5 == (RTCFilterFunctionN)0x0) {
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar94 = ZEXT1664(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar95 = ZEXT1664(auVar40);
              auVar56 = vxorps_avx512vl(auVar56,auVar56);
              auVar96 = ZEXT1664(auVar56);
            }
            else {
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar94 = ZEXT1664(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar95 = ZEXT1664(auVar40);
              auVar56 = vxorps_avx512vl(auVar56,auVar56);
              auVar96 = ZEXT1664(auVar56);
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var5)(&args);
                auVar56 = vxorps_avx512vl(auVar56,auVar56);
                auVar96 = ZEXT1664(auVar56);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar95 = ZEXT1664(auVar56);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar94 = ZEXT1664(auVar56);
              }
            }
            uVar38 = vptestmd_avx512vl(local_1988,local_1988);
            uVar38 = uVar38 & 0xf;
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar23 = (bool)((byte)uVar38 & 1);
            auVar57._0_4_ = (uint)bVar23 * auVar56._0_4_ | (uint)!bVar23 * *(int *)(args.ray + 0x80)
            ;
            bVar23 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar57._4_4_ = (uint)bVar23 * auVar56._4_4_ | (uint)!bVar23 * *(int *)(args.ray + 0x84)
            ;
            bVar23 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar57._8_4_ = (uint)bVar23 * auVar56._8_4_ | (uint)!bVar23 * *(int *)(args.ray + 0x88)
            ;
            bVar23 = SUB81(uVar38 >> 3,0);
            auVar57._12_4_ =
                 (uint)bVar23 * auVar56._12_4_ | (uint)!bVar23 * *(int *)(args.ray + 0x8c);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar57;
          }
          bVar23 = (bool)((byte)uVar38 & 1);
          auVar56._0_4_ = (uint)bVar23 * *(int *)pRVar1 | (uint)!bVar23 * auVar41._0_4_;
          bVar23 = (bool)((byte)(uVar38 >> 1) & 1);
          auVar56._4_4_ = (uint)bVar23 * *(int *)(ray + 0x84) | (uint)!bVar23 * auVar41._4_4_;
          bVar23 = (bool)((byte)(uVar38 >> 2) & 1);
          auVar56._8_4_ = (uint)bVar23 * *(int *)(ray + 0x88) | (uint)!bVar23 * auVar41._8_4_;
          bVar23 = SUB81(uVar38 >> 3,0);
          auVar56._12_4_ = (uint)bVar23 * *(int *)(ray + 0x8c) | (uint)!bVar23 * auVar41._12_4_;
          *(undefined1 (*) [16])pRVar1 = auVar56;
        }
        bVar32 = ((byte)uVar38 ^ 0xf) & bVar32;
      }
      lVar27 = lVar27 + 4;
      lVar26 = local_1950;
    } while (bVar32 != 0);
    bVar32 = 0;
LAB_01c8dc07:
    lVar26 = local_1950 + 1;
    lVar34 = lVar34 + 0x140;
    bVar29 = bVar29 & bVar32;
  } while (bVar29 != 0);
  bVar29 = 0;
LAB_01c8dc24:
  local_1a08._0_1_ = ~bVar29 & 0xf | (byte)local_1a08;
  uVar37 = (ulong)(byte)local_1a08;
  if ((byte)local_1a08 == 0xf) {
    local_1a08._0_1_ = 0xf;
LAB_01c8dc5f:
    local_1a08._0_1_ = (byte)local_1a08 & bVar36;
    bVar23 = (bool)((byte)local_1a08 >> 1 & 1);
    bVar6 = (bool)((byte)local_1a08 >> 2 & 1);
    *(uint *)pRVar1 =
         (uint)((byte)local_1a08 & 1) * -0x800000 |
         (uint)!(bool)((byte)local_1a08 & 1) * *(int *)pRVar1;
    *(uint *)(ray + 0x84) = (uint)bVar23 * -0x800000 | (uint)!bVar23 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)((byte)local_1a08 >> 3) * -0x800000 |
         (uint)!(bool)((byte)local_1a08 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  tray.tfar.field_0.i[0] =
       (uint)((byte)local_1a08 & 1) * auVar41._0_4_ |
       (uint)!(bool)((byte)local_1a08 & 1) * tray.tfar.field_0.i[0];
  bVar23 = (bool)((byte)local_1a08 >> 1 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar23 * auVar41._4_4_ | (uint)!bVar23 * tray.tfar.field_0.i[1];
  bVar23 = (bool)((byte)local_1a08 >> 2 & 1);
  tray.tfar.field_0.i[2] = (uint)bVar23 * auVar41._8_4_ | (uint)!bVar23 * tray.tfar.field_0.i[2];
  bVar23 = (bool)((byte)local_1a08 >> 3 & 1);
  tray.tfar.field_0.i[3] = (uint)bVar23 * auVar41._12_4_ | (uint)!bVar23 * tray.tfar.field_0.i[3];
  goto LAB_01c8d201;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }